

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

void __thiscall xmrig::String::String(String *this,char *str,size_t size)

{
  char *__dest;
  
  this->m_data = (char *)0x0;
  this->m_size = size;
  if (str == (char *)0x0) {
    this->m_size = 0;
  }
  else {
    __dest = (char *)operator_new__(size + 1);
    this->m_data = __dest;
    memcpy(__dest,str,size);
    __dest[size] = '\0';
  }
  return;
}

Assistant:

xmrig::String::String(const char *str, size_t size) :
    m_size(size)
{
    if (str == nullptr) {
        m_size = 0;

        return;
    }

    m_data = new char[m_size + 1];
    memcpy(m_data, str, m_size);
    m_data[m_size] = '\0';
}